

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  double dVar4;
  undefined1 local_2f8 [8];
  BTCprov q;
  Conductor local_cd [8];
  Conductor dipl;
  allocator local_b9;
  string local_b8 [8];
  string fn;
  char hostname [128];
  char **argv_local;
  int argc_local;
  
  bzero(fn.field_2._M_local_buf + 8,0x80);
  gethostname(fn.field_2._M_local_buf + 8,0x80);
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,pcVar1,&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::operator=((string *)diplo::server_port_abi_cxx11_,"9999");
  diplo::onlyPartition = 0;
  diplo::nbOfClients = 1;
  std::__cxx11::string::operator=((string *)diplo::moleculeconffile_abi_cxx11_,"");
  std::__cxx11::string::operator=((string *)diplo::dbDir_abi_cxx11_,"");
  diplo::pause_int = 0;
  diplo::maxScope = 0;
  diplo::minScope = 0;
  diplo::network_buf_size = 0x38;
  diplo::PartitionerRange = 1;
  diplo::ProvTrigerON = 0;
  std::__cxx11::string::operator=((string *)diplo::statsDir_abi_cxx11_,"btc/");
  std::__cxx11::string::operator=((string *)diplo::srcDir_abi_cxx11_,"../dataset/");
  if (1 < argc) {
    std::__cxx11::string::operator=((string *)diplo::file_q_abi_cxx11_,argv[1]);
  }
  if (argc == 3) {
    std::__cxx11::string::operator=((string *)diplo::file_p_abi_cxx11_,argv[2]);
  }
  diplo::stopwatch_start();
  diplo::onlyPartition = 1;
  Conductor::Conductor(local_cd);
  Conductor::LoadData(local_cd);
  poVar2 = std::operator<<((ostream *)&std::cout,"Loading Time: ");
  dVar4 = diplo::stopwatch_get();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Memory: ");
  diplo::memory_usage_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&q.field_0x200);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&q.field_0x200);
  queries::BTCprov::BTCprov((BTCprov *)local_2f8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    queries::BTCprov::TPDemo((BTCprov *)local_2f8);
  }
  queries::BTCprov::~BTCprov((BTCprov *)local_2f8);
  Conductor::~Conductor(local_cd);
  std::__cxx11::string::~string(local_b8);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    char hostname[128];
    bzero(hostname,128);
    gethostname(hostname, 128);

    string fn = argv[0];
    diplo::server_port = "9999";
    diplo::onlyPartition = false;
    diplo::nbOfClients = 1;
    diplo::moleculeconffile = "";
    diplo::dbDir = "";
    diplo::pause_int = 0;
    diplo::maxScope = 0;
    diplo::minScope = 0;
    diplo::network_buf_size = 56;
    diplo::PartitionerRange = 1;
    diplo::ProvTrigerON = false;
    statsDir="btc/";



     diplo::srcDir = "../dataset/";
				
				if (argc >= 2) diplo::file_q = argv[1];
				if (argc == 3) diplo::file_p = argv[2];
				
				
    diplo::stopwatch_start();
    diplo::onlyPartition = true;
    Conductor dipl;
    dipl.LoadData();



    cout << "Loading Time: " << diplo::stopwatch_get() << endl;
    cout << "Memory: " << diplo::memory_usage() << endl;

    queries::BTCprov q;

		if (!diplo::file_q.empty()) { 
			q.TPDemo();	
			return 0;
		}

}